

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_db_class.cpp
# Opt level: O0

void test_cpp_db::test_conversions_floating_point_invoker(void)

{
  unit_test_log_t *puVar1;
  basic_wrap_stringstream<char> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  char local_8c9;
  basic_wrap_stringstream<char> local_8c8;
  basic_cstring<const_char> local_730;
  basic_cstring<const_char> local_720;
  char local_709;
  basic_wrap_stringstream<char> local_708;
  basic_cstring<const_char> local_570;
  basic_cstring<const_char> local_560;
  char local_549;
  basic_wrap_stringstream<char> local_548;
  basic_cstring<const_char> local_3b0;
  basic_cstring<const_char> local_3a0;
  char local_389;
  basic_wrap_stringstream<char> local_388;
  basic_cstring<const_char> local_1f0;
  basic_cstring<const_char> local_1e0;
  test_conversions_floating_point local_1ce;
  char local_1cd [7];
  test_conversions_floating_point t;
  basic_wrap_stringstream<char> local_1c0;
  basic_cstring<const_char> local_28;
  basic_cstring<const_char> local_18;
  
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
             ,0x69);
  memset(&local_1c0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_1c0);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_1c0);
  local_1cd[0] = '\"';
  pbVar2 = boost::operator<<(pbVar2,local_1cd);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [32])"test_conversions_floating_point");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [15])"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_28,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_18,0x130,&local_28);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_1c0);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_1e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
             ,0x69);
  memset(&local_388,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_388);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_388);
  local_389 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_389);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [32])"test_conversions_floating_point");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [16])"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1f0,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_1e0,0x130,&local_1f0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_388);
  boost::unit_test::setup_conditional<test_cpp_db::test_conversions_floating_point>(&local_1ce);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_3a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
             ,0x69);
  memset(&local_548,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_548);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_548);
  local_549 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_549);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [32])"test_conversions_floating_point");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [13])"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3b0,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_3a0,0x130,&local_3b0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_548);
  test_conversions_floating_point::test_method(&local_1ce);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_560,
             "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
             ,0x69);
  memset(&local_708,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_708);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_708);
  local_709 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_709);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [32])"test_conversions_floating_point");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [19])"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_570,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_560,0x130,&local_570);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_708);
  boost::unit_test::teardown_conditional<test_cpp_db::test_conversions_floating_point>(&local_1ce);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_720,
             "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
             ,0x69);
  memset(&local_8c8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_8c8);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_8c8);
  local_8c9 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_8c9);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [32])"test_conversions_floating_point");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [15])"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_730,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_720,0x130,&local_730);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_8c8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_conversions_floating_point)
{
    cpp_db::value val_f{133.97f}, val_d{4711.0815}, val_ld{15.323l};

    float vf{133.97f};
    double vd{133.97};
    long double vld{133.97l};
    BOOST_CHECK_EQUAL(cpp_db::value_of<int8_t>(val_f), int8_t{-123});
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint8_t>(val_f), uint8_t{133});
    BOOST_CHECK_EQUAL(cpp_db::value_of<int16_t>(val_f), int16_t{133});
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint16_t>(val_f), uint16_t{133});
    BOOST_CHECK_EQUAL(cpp_db::value_of<int32_t>(val_f), int32_t{133});
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint32_t>(val_f), uint32_t{133});
    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(val_f), int64_t{133});
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint64_t>(val_f), uint64_t{133});
    BOOST_CHECK(std::fabs(cpp_db::value_of<float>(val_f) - vf) < 1e-5);
    BOOST_CHECK(std::fabs(cpp_db::value_of<double>(val_f) - vd) < 1e-5);
    BOOST_CHECK(std::fabs(cpp_db::value_of<long double>(val_f) - vld) < 1e-5);

    vf = 4711.0815f;
    vd = 4711.0815;
    vld = 4711.0815l;
    BOOST_CHECK_EQUAL(cpp_db::value_of<int8_t>(val_d), int8_t{103});
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint8_t>(val_d), uint8_t{103});
    BOOST_CHECK_EQUAL(cpp_db::value_of<int16_t>(val_d), int16_t{4711});
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint16_t>(val_d), uint16_t{4711});
    BOOST_CHECK_EQUAL(cpp_db::value_of<int32_t>(val_d), int32_t{4711});
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint32_t>(val_d), uint32_t{4711});
    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(val_d), int64_t{4711});
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint64_t>(val_d), uint64_t{4711});
    BOOST_CHECK(std::fabs(cpp_db::value_of<float>(val_d) - vf) < 1e-5);
    BOOST_CHECK(std::fabs(cpp_db::value_of<double>(val_d) - vd) < 1e-5);
    BOOST_CHECK(std::fabs(cpp_db::value_of<long double>(val_d) - vld) < 1e-5);

    vf = 15.323f;
    vd = 15.323;
    vld = 15.323l;
    BOOST_CHECK_EQUAL(cpp_db::value_of<int8_t>(val_ld), int8_t{15});
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint8_t>(val_ld), uint8_t{15});
    BOOST_CHECK_EQUAL(cpp_db::value_of<int16_t>(val_ld), int16_t{15});
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint16_t>(val_ld), uint16_t{15});
    BOOST_CHECK_EQUAL(cpp_db::value_of<int32_t>(val_ld), int32_t{15});
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint32_t>(val_ld), uint32_t{15});
    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(val_ld), int64_t{15});
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint64_t>(val_ld), uint64_t{15});
    BOOST_CHECK(std::fabs(cpp_db::value_of<float>(val_ld) - vf) < 1e-5);
    BOOST_CHECK(std::fabs(cpp_db::value_of<double>(val_ld) - vd) < 1e-5);
    BOOST_CHECK(std::fabs(cpp_db::value_of<long double>(val_ld) - vld) < 1e-5);
}